

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::read_regular_image
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  image_u8 *dest;
  mip_level *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  undefined1 *rhs;
  
  dest = (image_u8 *)
         crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this);
  p = (image<crnlib::color_quad<unsigned_char,_int>_> *)serializer;
  bVar1 = image_utils::read_from_stream(dest,serializer,0);
  if (bVar1) {
    this_00 = crnlib_new<crnlib::mip_level>();
    mip_level::assign(this_00,dest,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
    assign(this,this_00);
    if (serializer->m_pStream == (data_stream *)0x0) {
      rhs = g_empty_dynamic_string;
    }
    else {
      rhs = (undefined1 *)&serializer->m_pStream->m_name;
    }
    dynamic_string::operator=(&this->m_name,(dynamic_string *)rhs);
  }
  else {
    crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)dest,p);
    dynamic_string::operator=(&this->m_last_error,"Failed loading image file");
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_regular_image(data_stream_serializer& serializer) {
  image_u8* pImg = crnlib_new<image_u8>();
  bool status = image_utils::read_from_stream(*pImg, serializer, 0);
  if (!status) {
    crnlib_delete(pImg);

    set_last_error("Failed loading image file");
    return false;
  }

  mip_level* pLevel = crnlib_new<mip_level>();
  pLevel->assign(pImg);

  assign(pLevel);
  set_name(serializer.get_name());

  return true;
}